

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_push_level(Parser *this,bool explicit_flow_chars)

{
  State *pSVar1;
  pfn_error p_Var2;
  Location LVar3;
  Location loc;
  Location loc_00;
  bool bVar4;
  error_flags eVar5;
  NodeData *pNVar6;
  byte in_SIL;
  Parser *in_RDI;
  flag_t st;
  char msg [42];
  undefined4 in_stack_fffffffffffffed8;
  flag_t in_stack_fffffffffffffedc;
  Parser *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  Location *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  Location *in_stack_ffffffffffffff00;
  Parser *this_00;
  Parser *msg_00;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffff40;
  Parser *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  Location *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char local_98 [47];
  byte local_69;
  undefined8 local_60;
  flag_t fStack_5c;
  Parser *pPStack_58;
  stack<c4::yml::Parser::State,_16UL> *local_38;
  undefined8 local_30;
  Parser *pPStack_28;
  char *local_20;
  Location *pLStack_18;
  char *local_10;
  stack<c4::yml::Parser::State,_16UL> *local_8;
  
  local_69 = in_SIL & 1;
  pSVar1 = in_RDI->m_state;
  local_8 = &in_RDI->m_stack;
  this_00 = in_RDI;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (size_t)in_stack_fffffffffffffee0,
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_fffffffffffffed8 = (undefined4)local_30;
    in_stack_fffffffffffffedc = (flag_t)((ulong)local_30 >> 0x20);
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff48;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff40;
    loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff50;
    loc.name.str = (char *)in_stack_ffffffffffffff58;
    loc.name.len = in_stack_ffffffffffffff60;
    error<25ul>((char (*) [25])this_00,loc);
    in_stack_fffffffffffffee0 = pPStack_28;
    in_stack_fffffffffffffee8 = local_20;
    in_stack_fffffffffffffef0 = pLStack_18;
    in_stack_fffffffffffffef8 = local_10;
  }
  if (pSVar1 != (in_RDI->m_stack).m_stack + ((in_RDI->m_stack).m_size - 1)) {
    memcpy(local_98,"check failed: (m_state == &m_stack.top())",0x2a);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var2 = (this_00->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       (size_t)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,
                       (size_t)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffef0 = in_stack_ffffffffffffff58;
    in_stack_fffffffffffffee8 = in_stack_ffffffffffffff50;
    in_stack_fffffffffffffee0 = in_stack_ffffffffffffff48;
    in_stack_fffffffffffffed8 = SUB84(in_stack_ffffffffffffff40,0);
    in_stack_fffffffffffffedc = (flag_t)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    LVar3.super_LineCol.line = (size_t)in_stack_fffffffffffffee0;
    LVar3.super_LineCol.offset = (size_t)in_stack_ffffffffffffff40;
    LVar3.super_LineCol.col = (size_t)in_stack_fffffffffffffee8;
    LVar3.name.str = (char *)in_stack_fffffffffffffef0;
    LVar3.name.len = in_stack_ffffffffffffff60;
    in_stack_ffffffffffffff48 = in_stack_fffffffffffffee0;
    in_stack_ffffffffffffff50 = in_stack_fffffffffffffee8;
    in_stack_ffffffffffffff58 = in_stack_fffffffffffffef0;
    (*p_Var2)(local_98,0x2a,LVar3,(this_00->m_stack).m_callbacks.m_user_data);
  }
  pNVar6 = node(in_stack_fffffffffffffee0,
                (State *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (pNVar6 != (NodeData *)0x0) {
    if ((local_69 & 1) == 0) {
      has_all(this_00,0x10);
    }
    detail::stack<c4::yml::Parser::State,_16UL>::push_top(in_stack_ffffffffffffff40);
    local_38 = &this_00->m_stack;
    msg_00 = this_00;
    if ((this_00->m_stack).m_size == 0) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (size_t)in_stack_fffffffffffffee0,
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      loc_00.super_LineCol.line = (size_t)in_stack_ffffffffffffff48;
      loc_00.super_LineCol.offset = (size_t)in_stack_ffffffffffffff40;
      loc_00.super_LineCol.col = (size_t)in_stack_ffffffffffffff50;
      loc_00.name.str = (char *)in_stack_ffffffffffffff58;
      loc_00.name.len = in_stack_ffffffffffffff60;
      error<25ul>((char (*) [25])msg_00,loc_00);
      in_stack_fffffffffffffedc = fStack_5c;
      in_stack_fffffffffffffee0 = pPStack_58;
    }
    msg_00->m_state = (this_00->m_stack).m_stack + ((this_00->m_stack).m_size - 1);
    set_flags(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    msg_00->m_state->node_id = 0xffffffffffffffff;
    msg_00->m_state->indref = 0xffffffffffffffff;
    msg_00->m_state->level = msg_00->m_state->level + 1;
  }
  return;
}

Assistant:

void Parser::_push_level(bool explicit_flow_chars)
{
    _c4dbgpf("pushing level! currnode={}  currlevel={} stacksize={} stackcap={}", m_state->node_id, m_state->level, m_stack.size(), m_stack.capacity());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state == &m_stack.top());
    if(node(m_state) == nullptr)
    {
        _c4dbgp("pushing level! actually no, current node is null");
        //_RYML_CB_ASSERT(m_stack.m_callbacks,  ! explicit_flow_chars);
        return;
    }
    flag_t st = RUNK;
    if(explicit_flow_chars || has_all(FLOW))
    {
        st |= FLOW;
    }
    m_stack.push_top();
    m_state = &m_stack.top();
    set_flags(st);
    m_state->node_id = (size_t)NONE;
    m_state->indref = (size_t)NONE;
    ++m_state->level;
    _c4dbgpf("pushing level: now, currlevel={}", m_state->level);
}